

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  string_type local_38;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  root_name_length(this);
  std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
  path(__return_storage_ptr__,&local_38,native_format);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_name() const
{
    return path(_path.substr(_prefixLength, root_name_length()), native_format);
}